

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  char *args;
  undefined4 in_register_00000034;
  string local_38;
  LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  StringExpr *string_local;
  ASTPrinter *this_local;
  
  local_18 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_register_00000034,__fd);
  string_local = (StringExpr *)this;
  value = LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value(local_18);
  escape(&local_38,value);
  args = (char *)std::__cxx11::string::c_str();
  printf<char_const*>(this,"StringExpr: \"%s\"\n",args);
  iVar1 = std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

void ASTPrinter::accept(StringExpr& string) {
  printf("StringExpr: \"%s\"\n", escape(string.value()).c_str());
}